

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O0

XmlReaderPtr __thiscall
Assimp::Ogre::OgreXmlSerializer::OpenReader
          (OgreXmlSerializer *this,IOSystem *pIOHandler,string *filename)

{
  string *pFile;
  string *this_00;
  bool bVar1;
  Logger *pLVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  IOStream *__p;
  pointer pIVar5;
  DeadlyImportError *pDVar6;
  CIrrXML_IOStreamReader *this_01;
  pointer callback;
  IrrXMLReader *__p_00;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  XmlReaderPtr XVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  undefined1 local_3e9;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  local_3e8;
  unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
  stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  allocator local_3b1;
  string local_3b0;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_390;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  string local_210;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *filename_local;
  IOSystem *pIOHandler_local;
  XmlReaderPtr *reader;
  
  local_20 = filename;
  filename_local = (string *)pIOHandler;
  pIOHandler_local = (IOSystem *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,".skeleton.xml",&local_41);
  bVar1 = EndsWith(filename,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = IOSystem::Exists((IOSystem *)filename_local,local_20);
    this_00 = filename_local;
    pFile = local_20;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b0,"rb",&local_3b1);
      __p = IOSystem::Open((IOSystem *)this_00,pFile,&local_3b0);
      std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
      unique_ptr<std::default_delete<Assimp::IOStream>,void>
                ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_390,
                 __p);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                         (&local_390);
      if (pIVar5 == (pointer)0x0) {
        stream._M_t.
        super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
        .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl._7_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_3d8,"Failed to open skeleton file ",local_20);
        DeadlyImportError::DeadlyImportError(pDVar6,&local_3d8);
        stream._M_t.
        super___uniq_ptr_impl<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::CIrrXML_IOStreamReader_*,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
        .super__Head_base<0UL,_Assimp::CIrrXML_IOStreamReader_*,_false>._M_head_impl._7_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
      pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get
                         (&local_390);
      CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,pIVar5);
      std::
      unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
      ::unique_ptr<std::default_delete<Assimp::CIrrXML_IOStreamReader>,void>
                ((unique_ptr<Assimp::CIrrXML_IOStreamReader,std::default_delete<Assimp::CIrrXML_IOStreamReader>>
                  *)&local_3e8,this_01);
      local_3e9 = 0;
      callback = std::
                 unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
                 ::get(&local_3e8);
      __p_00 = irr::io::createIrrXMLReader(&callback->super_IFileReadCallBack);
      std::shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>>::
      shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>,void>
                ((shared_ptr<irr::io::IIrrXMLReader<char,irr::io::IXMLBase>> *)this,__p_00);
      peVar7 = std::
               __shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
               ::get((__shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                      *)this);
      if (peVar7 == (element_type *)0x0) {
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_410,"Failed to create XML reader for skeleton file ",local_20);
        DeadlyImportError::DeadlyImportError(pDVar6,&local_410);
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      local_3e9 = 1;
      std::
      unique_ptr<Assimp::CIrrXML_IOStreamReader,_std::default_delete<Assimp::CIrrXML_IOStreamReader>_>
      ::~unique_ptr(&local_3e8);
      std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                (&local_390);
      _Var8._M_pi = extraout_RDX_01;
    }
    else {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (char (*) [31])"Failed to find skeleton file \'");
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&file,
                         local_20);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar3,(char (*) [39])"\' that is referenced by imported Mesh.");
      Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar4);
      Logger::error(pLVar2,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&file
                      );
      std::shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>::shared_ptr
                ((shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_> *)this);
      _Var8._M_pi = extraout_RDX_00;
    }
  }
  else {
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              (&local_1f0,(char (*) [46])"Imported Mesh is referencing to unsupported \'");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1f0,local_20);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar3,(char (*) [17])"\' skeleton file.");
    Formatter::basic_formatter::operator_cast_to_string(&local_78,pbVar4);
    Logger::error(pLVar2,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1f0);
    std::shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_>::shared_ptr
              ((shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>_> *)this);
    _Var8._M_pi = extraout_RDX;
  }
  XVar9.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  XVar9.
  super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (XmlReaderPtr)
         XVar9.
         super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

XmlReaderPtr OgreXmlSerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton.xml", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return XmlReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return XmlReaderPtr();
    }

    std::unique_ptr<IOStream> file(pIOHandler->Open(filename));
    if (!file.get()) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    std::unique_ptr<CIrrXML_IOStreamReader> stream(new CIrrXML_IOStreamReader(file.get()));
    XmlReaderPtr reader = XmlReaderPtr(irr::io::createIrrXMLReader(stream.get()));
    if (!reader.get()) {
        throw DeadlyImportError("Failed to create XML reader for skeleton file " + filename);
    }
    return reader;
}